

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Menu_.cxx
# Opt level: O0

int __thiscall Fl_Menu_::clear_submenu(Fl_Menu_ *this,int index)

{
  int iVar1;
  uint uVar2;
  int index_local;
  Fl_Menu_ *this_local;
  
  if ((index < 0) || (iVar1 = size(this), iVar1 <= index)) {
    this_local._4_4_ = -1;
  }
  else if ((this->menu_[index].flags & 0x40U) == 0) {
    this_local._4_4_ = -1;
  }
  else {
    uVar2 = index + 1;
    while ((iVar1 = size(this), (int)uVar2 < iVar1 && (this->menu_[(int)uVar2].text != (char *)0x0))
          ) {
      remove(this,(char *)(ulong)uVar2);
    }
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int Fl_Menu_::clear_submenu(int index) {
  if ( index < 0 || index >= size() ) return(-1);
  if ( ! (menu_[index].flags & FL_SUBMENU) ) return(-1);
  ++index;					// advance to first item in submenu
  while ( index < size() ) {                    // keep remove()ing top item until end is reached
    if ( menu_[index].text == 0 ) break;	// end of this submenu? done
    remove(index);				// remove items/submenus
  }
  return(0);
}